

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanical.cpp
# Opt level: O0

bool __thiscall Mechanization::UpdatePosi(Mechanization *this,Output now)

{
  double dVar1;
  code *pcVar2;
  ELLIPSOID type;
  ELLIPSOID type_00;
  Scalar *pSVar3;
  void *in_RDI;
  double dVar4;
  double dVar5;
  double rn;
  double phi;
  double h;
  double rm;
  Index in_stack_fffffffffffffec0;
  Index in_stack_fffffffffffffec8;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *in_stack_fffffffffffffed0;
  Scalar SVar6;
  double dVar7;
  undefined8 uVar8;
  undefined8 in_stack_ffffffffffffff08;
  Scalar SVar9;
  double in_stack_ffffffffffffff10;
  double dVar10;
  undefined1 local_b8 [24];
  double dStack_a0;
  Index local_98;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *pDStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  double local_70;
  double local_68;
  double local_60;
  undefined1 local_58 [24];
  double dStack_40;
  Index local_38;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *pDStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  double local_10;
  
  dVar7 = *(double *)((long)in_RDI + 0x88);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0)
  ;
  SVar6 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0)
  ;
  *(double *)((long)in_RDI + 0xa0) = dVar7 - ((SVar6 + *pSVar3) * 0.5 * 1.0) / 200.0;
  uVar8 = *(undefined8 *)((long)in_RDI + 0x78);
  memcpy(local_58,in_RDI,0x48);
  type.b = (double)local_28;
  type.a = (double)pDStack_30;
  type.c = (double)uStack_20;
  type.alpha = (double)local_18;
  type.e2 = SVar6;
  type.e1_2 = dVar7;
  type.gama_a = (double)uVar8;
  type.gama_b = (double)in_stack_ffffffffffffff08;
  type.GM = in_stack_ffffffffffffff10;
  local_10 = RM(dStack_40,type);
  local_60 = (*(double *)((long)in_RDI + 0xa0) + *(double *)((long)in_RDI + 0x88)) * 0.5;
  dVar10 = *(double *)((long)in_RDI + 0x78);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (pDStack_30,local_38,(Index)dStack_40);
  SVar9 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (pDStack_30,local_38,(Index)dStack_40);
  *(double *)((long)in_RDI + 0x90) =
       dVar10 + ((((SVar9 + *pSVar3) * 0.5) / (local_10 + local_60)) * 1.0) / 200.0;
  local_68 = (*(double *)((long)in_RDI + 0x78) + *(double *)((long)in_RDI + 0x90)) * 0.5;
  memcpy(local_b8,in_RDI,0x48);
  type_00.b = (double)local_88;
  type_00.a = (double)pDStack_90;
  type_00.c = (double)uStack_80;
  type_00.alpha = (double)local_78;
  type_00.e2 = SVar6;
  type_00.e1_2 = dVar7;
  type_00.gama_a = (double)uVar8;
  type_00.gama_b = SVar9;
  type_00.GM = dVar10;
  local_70 = RN(dStack_a0,type_00);
  dVar7 = *(double *)((long)in_RDI + 0x80);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (pDStack_90,local_98,(Index)dStack_a0);
  dVar10 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (pDStack_90,local_98,(Index)dStack_a0);
  dVar1 = *pSVar3;
  dVar4 = local_70 + local_60;
  dVar5 = cos(local_68);
  *(double *)((long)in_RDI + 0x98) =
       dVar7 + ((((dVar10 + dVar1) * 0.5) / (dVar4 * dVar5)) * 1.0) / 200.0;
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

bool Mechanization::UpdatePosi(Output now) {
    this->nowPosi.H = prvPosi.H - 0.5 * (prvVel(2, 0) + nowVel(2, 0)) * 1.0 / ZCF;
    // cout << this->nowPosi.H << endl;

    double rm = RM(prvPosi.B, type);
    double h = 0.5 * (nowPosi.H + prvPosi.H);
    this->nowPosi.B = prvPosi.B + 0.5 * (prvVel(0, 0) + nowVel(0, 0)) / (rm + h) * 1.0 / ZCF;
    // cout << Rad2Deg(this->nowPosi.B) << endl;
    
    double phi = 0.5 * (prvPosi.B + nowPosi.B);
    double rn = RN(phi, type);
    // cout << setprecision(15) << rn << endl;
    this->nowPosi.L = prvPosi.L + 0.5 * (prvVel(1, 0) + nowVel(1, 0)) / ((rn + h) * cos(phi)) * 1.0 / ZCF;
    // cout << Rad2Deg(this->nowPosi.L) << endl;
}